

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5SamplerArrayIndexing.cpp
# Opt level: O3

void __thiscall glcts::GPUShader5SamplerArrayIndexing::deinit(GPUShader5SamplerArrayIndexing *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 8))(0x84c0);
  (**(code **)(lVar2 + 0xb8))(0xde1,0);
  (**(code **)(lVar2 + 0x78))(0x8d40,0);
  (**(code **)(lVar2 + 0xd8))(0);
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  if (this->m_vbo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vbo_id);
    this->m_vbo_id = 0;
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_big_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_big_to_id);
    this->m_big_to_id = 0;
  }
  if (this->m_small_to_ids != (GLuint *)0x0) {
    (**(code **)(lVar2 + 0x480))(4);
    if (this->m_small_to_ids != (GLuint *)0x0) {
      operator_delete__(this->m_small_to_ids);
    }
    this->m_small_to_ids = (GLuint *)0x0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GPUShader5SamplerArrayIndexing::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	if (m_vbo_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_id);
		m_vbo_id = 0;
	}

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	if (m_big_to_id != 0)
	{
		gl.deleteTextures(1, &m_big_to_id);
		m_big_to_id = 0;
	}

	if (m_small_to_ids != DE_NULL)
	{
		gl.deleteTextures(m_n_small_textures, m_small_to_ids);
		delete[] m_small_to_ids;
		m_small_to_ids = DE_NULL;
	}

	/* Release base class */
	TestCaseBase::deinit();
}